

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImFontConfig * __thiscall
ImVector<ImFontConfig>::insert(ImVector<ImFontConfig> *this,ImFontConfig *it,ImFontConfig *v)

{
  int iVar1;
  int new_capacity;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ImFontConfig *pIVar6;
  
  pIVar6 = this->Data;
  if (pIVar6 <= it) {
    iVar1 = this->Size;
    lVar3 = (long)iVar1;
    if (it <= pIVar6 + lVar3) {
      lVar5 = (long)it - (long)pIVar6;
      if (iVar1 == this->Capacity) {
        if (iVar1 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar1 / 2 + iVar1;
        }
        new_capacity = iVar1 + 1;
        if (iVar1 + 1 < iVar2) {
          new_capacity = iVar2;
        }
        reserve(this,new_capacity);
        lVar3 = (long)this->Size;
        pIVar6 = this->Data;
      }
      lVar4 = lVar3 - lVar5 / 0x88;
      if (lVar4 != 0 && lVar5 / 0x88 <= lVar3) {
        memmove((void *)((long)pIVar6 + lVar5 + 0x88),(void *)((long)pIVar6 + lVar5),lVar4 * 0x88);
        pIVar6 = this->Data;
      }
      memcpy((void *)((long)pIVar6 + lVar5),v,0x88);
      this->Size = this->Size + 1;
      return (ImFontConfig *)(lVar5 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<ImFontConfig>::insert(const T *, const T &) [T = ImFontConfig]")
  ;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }